

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O2

void captureCursor(_GLFWwindow *window)

{
  Window WVar1;
  
  WVar1 = (window->x11).handle;
  (*_glfw.x11.xlib.GrabPointer)(_glfw.x11.display,WVar1,1,0x4c,1,1,WVar1,0,0);
  return;
}

Assistant:

static void captureCursor(_GLFWwindow* window)
{
    XGrabPointer(_glfw.x11.display, window->x11.handle, True,
                 ButtonPressMask | ButtonReleaseMask | PointerMotionMask,
                 GrabModeAsync, GrabModeAsync,
                 window->x11.handle,
                 None,
                 CurrentTime);
}